

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.cpp
# Opt level: O1

void __thiscall
btConeTwistConstraint::calcAngleInfo2
          (btConeTwistConstraint *this,btTransform *transA,btTransform *transB,
          btMatrix3x3 *invInertiaWorldA,btMatrix3x3 *invInertiaWorldB)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  btScalar bVar12;
  btScalar bVar13;
  btScalar bVar14;
  btScalar bVar15;
  btScalar bVar16;
  btScalar bVar17;
  btScalar bVar18;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  undefined4 extraout_EAX_03;
  undefined4 uVar19;
  int iVar20;
  btConeTwistConstraint *this_00;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  btScalar bVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  btQuaternion q;
  btScalar swingLimit;
  btScalar swingAngle;
  btQuaternion q_1;
  btVector3 local_248;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [12];
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  float local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  btScalar local_120;
  float local_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  btMatrix3x3 local_b8;
  undefined8 local_88;
  undefined8 uStack_80;
  btMatrix3x3 local_78;
  undefined1 local_48 [16];
  
  this->m_twistLimitSign = 0.0;
  this->m_swingCorrection = 0.0;
  this->m_solveTwistLimit = false;
  this->m_solveSwingLimit = false;
  if ((this->m_bMotorEnabled == true) && (this->m_useSolveConstraintObsolete == false)) {
    btMatrix3x3::setRotation(&local_b8,&this->m_qTarget);
    local_88 = 0;
    uStack_80 = 0;
    fVar28 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[0];
    fVar29 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[0];
    fVar31 = (transA->m_basis).m_el[0].m_floats[0];
    fVar32 = (transA->m_basis).m_el[0].m_floats[1];
    fVar34 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[0];
    fVar35 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[2];
    fVar36 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[2];
    fVar37 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[2];
    fVar40 = (transA->m_basis).m_el[2].m_floats[0];
    fVar42 = (transA->m_basis).m_el[2].m_floats[1];
    fVar43 = (transA->m_basis).m_el[2].m_floats[2];
    fVar21 = fVar34 * fVar43 + fVar28 * fVar40 + fVar29 * fVar42;
    _local_218 = ZEXT416((uint)fVar21);
    fVar22 = fVar37 * fVar43 + fVar35 * fVar40 + fVar36 * fVar42;
    fVar45 = (this->m_rbAFrame).m_origin.m_floats[1];
    fVar47 = (this->m_rbAFrame).m_origin.m_floats[0];
    fVar53 = (transA->m_basis).m_el[0].m_floats[2];
    fVar58 = (this->m_rbAFrame).m_origin.m_floats[2];
    fVar27 = (transA->m_basis).m_el[1].m_floats[1];
    fVar48 = (transA->m_basis).m_el[1].m_floats[0];
    fVar52 = (transA->m_basis).m_el[1].m_floats[2];
    fVar50 = (this->m_rbBFrame).m_basis.m_el[1].m_floats[0];
    _local_1d8 = ZEXT416((uint)fVar50);
    fVar2 = (transB->m_basis).m_el[2].m_floats[1];
    fVar54 = (this->m_rbBFrame).m_basis.m_el[0].m_floats[0];
    _local_1e8 = ZEXT416((uint)fVar54);
    fVar1 = (transB->m_basis).m_el[2].m_floats[0];
    fVar56 = (this->m_rbBFrame).m_basis.m_el[2].m_floats[0];
    _local_1b8 = ZEXT416((uint)fVar56);
    fVar23 = (transB->m_basis).m_el[2].m_floats[2];
    fVar41 = fVar56 * fVar23 + fVar54 * fVar1 + fVar50 * fVar2;
    fVar30 = (this->m_rbBFrame).m_basis.m_el[1].m_floats[1];
    _local_1a8 = ZEXT416((uint)fVar30);
    fVar38 = (this->m_rbBFrame).m_basis.m_el[0].m_floats[1];
    fVar39 = (this->m_rbBFrame).m_basis.m_el[2].m_floats[1];
    local_f8 = ZEXT416((uint)fVar23);
    fVar46 = fVar39 * fVar23 + fVar38 * fVar1 + fVar30 * fVar2;
    fVar44 = (this->m_rbBFrame).m_origin.m_floats[1];
    fVar51 = (this->m_rbBFrame).m_origin.m_floats[0];
    fVar55 = (this->m_rbBFrame).m_origin.m_floats[2];
    _local_148 = ZEXT416((uint)local_b8.m_el[1].m_floats[0]);
    _local_138 = ZEXT416((uint)local_b8.m_el[0].m_floats[0]);
    fVar25 = local_b8.m_el[0].m_floats[0] * fVar41 + fVar46 * local_b8.m_el[1].m_floats[0];
    local_108 = ZEXT416((uint)fVar25);
    _local_208 = ZEXT416((uint)local_b8.m_el[1].m_floats[2]);
    _local_1f8 = ZEXT416((uint)local_b8.m_el[0].m_floats[2]);
    fVar26 = local_b8.m_el[0].m_floats[2] * fVar41 + fVar46 * local_b8.m_el[1].m_floats[2];
    local_118 = ZEXT416((uint)fVar26);
    _local_1c8 = ZEXT416(0);
    fVar49 = -(fVar58 * fVar53 + fVar47 * fVar31 + fVar32 * fVar45 + (transA->m_origin).m_floats[0])
    ;
    fVar59 = fVar34 * fVar53 + fVar28 * fVar31 + fVar29 * fVar32;
    fVar61 = fVar34 * fVar52 + fVar28 * fVar48 + fVar29 * fVar27;
    fVar57 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[1];
    fVar28 = (this->m_rbBFrame).m_basis.m_el[1].m_floats[2];
    local_d8 = ZEXT416((uint)fVar28);
    fVar10 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[1];
    fVar29 = (this->m_rbBFrame).m_basis.m_el[0].m_floats[2];
    local_e8 = ZEXT416((uint)fVar29);
    fVar11 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[1];
    fVar34 = (this->m_rbBFrame).m_basis.m_el[2].m_floats[2];
    local_c8 = fVar11 * fVar53 + fVar10 * fVar31 + fVar57 * fVar32;
    fStack_c4 = fVar11 * fVar52 + fVar10 * fVar48 + fVar57 * fVar27;
    fStack_c0 = fVar11 * 0.0 + fVar10 * 0.0 + fVar57 * 0.0;
    fStack_bc = fVar11 * 0.0 + fVar10 * 0.0 + fVar57 * 0.0;
    fVar53 = fVar37 * fVar53 + fVar35 * fVar31 + fVar36 * fVar32;
    fVar24 = fVar37 * fVar52 + fVar35 * fVar48 + fVar36 * fVar27;
    fVar31 = fVar58 * fVar52 + fVar47 * fVar48 + fVar27 * fVar45 + (transA->m_origin).m_floats[1];
    fVar32 = fVar58 * fVar43 + fVar47 * fVar40 + fVar45 * fVar42 + (transA->m_origin).m_floats[2];
    fVar60 = (fVar59 * fVar49 - fVar61 * fVar31) - fVar21 * fVar32;
    fVar42 = fVar43 * fVar11 + fVar40 * fVar10 + fVar42 * fVar57;
    fVar43 = fVar23 * fVar34 + fVar1 * fVar29 + fVar2 * fVar28;
    local_198 = ZEXT416((uint)local_b8.m_el[2].m_floats[0]);
    fVar25 = local_b8.m_el[2].m_floats[0] * fVar43 + fVar25;
    local_188 = ZEXT416((uint)local_b8.m_el[2].m_floats[2]);
    fVar26 = local_b8.m_el[2].m_floats[2] * fVar43 + fVar26;
    local_178 = ZEXT416(0);
    fVar57 = -fVar32 * fVar42 + fVar49 * local_c8 + -fVar31 * fStack_c4;
    fStack_154 = local_b8.m_el[2].m_floats[1] * fVar43 +
                 fVar41 * local_b8.m_el[0].m_floats[1] + local_b8.m_el[1].m_floats[1] * fVar46;
    local_158 = fStack_154;
    fStack_150 = fStack_154;
    fStack_14c = fStack_154;
    local_78.m_el[2].m_floats[2] = fVar22 * fVar26 + fVar21 * fVar25 + fVar42 * fStack_154;
    _local_228 = ZEXT416((uint)local_78.m_el[2].m_floats[2]);
    local_238 = (fVar49 * fVar53 - fVar24 * fVar31) - fVar32 * fVar22;
    fStack_234 = -0.0;
    fStack_230 = -0.0;
    fStack_22c = -0.0;
    local_168 = local_238 * fVar26 + fVar60 * fVar25 + fVar57 * fStack_154;
    uStack_164 = 0x80000000;
    uStack_160 = 0x80000000;
    uStack_15c = 0x80000000;
    fVar36 = (transB->m_basis).m_el[0].m_floats[1];
    fVar31 = (transB->m_basis).m_el[1].m_floats[1];
    fVar37 = (transB->m_basis).m_el[0].m_floats[0];
    fVar32 = (transB->m_basis).m_el[1].m_floats[0];
    fVar40 = (transB->m_basis).m_el[0].m_floats[2];
    fVar35 = (transB->m_basis).m_el[1].m_floats[2];
    fVar45 = fVar56 * fVar40 + fVar54 * fVar37 + fVar50 * fVar36;
    fVar47 = fVar56 * fVar35 + fVar54 * fVar32 + fVar50 * fVar31;
    fVar58 = fVar39 * fVar40 + fVar38 * fVar37 + fVar30 * fVar36;
    fVar27 = fVar39 * fVar35 + fVar38 * fVar32 + fVar30 * fVar31;
    fVar52 = fVar34 * fVar40 + fVar29 * fVar37 + fVar28 * fVar36;
    fVar50 = fVar34 * fVar35 + fVar29 * fVar32 + fVar28 * fVar31;
    uVar3 = *(undefined8 *)(transB->m_origin).m_floats;
    fVar34 = local_b8.m_el[2].m_floats[0] * fVar52 +
             local_b8.m_el[0].m_floats[0] * fVar45 + local_b8.m_el[1].m_floats[0] * fVar58;
    fVar48 = local_b8.m_el[2].m_floats[0] * fVar50 +
             local_b8.m_el[0].m_floats[0] * fVar47 + local_b8.m_el[1].m_floats[0] * fVar27;
    fVar28 = local_b8.m_el[2].m_floats[1] * fVar52 +
             local_b8.m_el[0].m_floats[1] * fVar45 + local_b8.m_el[1].m_floats[1] * fVar58;
    fVar29 = local_b8.m_el[2].m_floats[1] * fVar50 +
             local_b8.m_el[0].m_floats[1] * fVar47 + local_b8.m_el[1].m_floats[1] * fVar27;
    fVar54 = local_b8.m_el[2].m_floats[2] * fVar52 +
             local_b8.m_el[0].m_floats[2] * fVar45 + local_b8.m_el[1].m_floats[2] * fVar58;
    fVar56 = local_b8.m_el[2].m_floats[2] * fVar50 +
             local_b8.m_el[0].m_floats[2] * fVar47 + local_b8.m_el[1].m_floats[2] * fVar27;
    local_78.m_el[0].m_floats[2] = fVar22 * fVar54 + fVar21 * fVar34 + fVar42 * fVar28;
    local_78.m_el[1].m_floats[2] = fVar22 * fVar56 + fVar21 * fVar48 + fVar42 * fVar29;
    local_78.m_el[0].m_floats[1] = fVar54 * fVar24 + fVar34 * fVar61 + fVar28 * fStack_c4;
    local_78.m_el[0].m_floats[0] = fVar54 * fVar53 + fVar34 * fVar59 + fVar28 * local_c8;
    local_78.m_el[0].m_floats[3] = 0.0;
    local_78.m_el[1].m_floats[1] = fVar56 * fVar24 + fVar48 * fVar61 + fVar29 * fStack_c4;
    local_78.m_el[1].m_floats[0] = fVar56 * fVar53 + fVar48 * fVar59 + fVar29 * local_c8;
    local_78.m_el[1].m_floats[3] = 0.0;
    local_78.m_el[2].m_floats[1] = fVar26 * fVar24 + fVar25 * fVar61 + fStack_154 * fStack_c4;
    local_78.m_el[2].m_floats[0] = fVar26 * fVar53 + fVar25 * fVar59 + fStack_154 * local_c8;
    local_78.m_el[2].m_floats[3] = 0.0;
    local_48._4_4_ =
         local_238 * fVar56 + fVar60 * fVar48 + fVar57 * fVar29 +
         fVar50 * 0.0 + fVar47 * 0.0 + fVar27 * 0.0 +
         (float)((ulong)uVar3 >> 0x20) + fVar55 * fVar35 + fVar51 * fVar32 + fVar44 * fVar31;
    local_48._0_4_ =
         local_238 * fVar54 + fVar60 * fVar34 + fVar57 * fVar28 +
         fVar52 * 0.0 + fVar45 * 0.0 + fVar58 * 0.0 +
         (float)uVar3 + fVar55 * fVar40 + fVar51 * fVar37 + fVar44 * fVar36;
    local_48._8_4_ =
         local_168 +
         fVar43 * 0.0 + fVar41 * 0.0 + fVar46 * 0.0 +
         fVar55 * fVar23 + fVar51 * fVar1 + fVar2 * fVar44 + (transB->m_origin).m_floats[2];
    local_48._12_4_ = 0;
    btMatrix3x3::getRotation(&local_78,(btQuaternion *)&local_248);
    fVar28 = local_248.m_floats[2] * local_248.m_floats[2] +
             local_248.m_floats[0] * local_248.m_floats[0] +
             local_248.m_floats[1] * local_248.m_floats[1];
    if (1.1920929e-07 <= ABS(fVar28)) {
      *(undefined8 *)(this->m_swingAxis).m_floats = local_248.m_floats._0_8_;
      (this->m_swingAxis).m_floats[2] = local_248.m_floats[2];
      (this->m_swingAxis).m_floats[3] = 0.0;
      if (fVar28 < 0.0) {
        fVar28 = sqrtf(fVar28);
      }
      else {
        fVar28 = SQRT(fVar28);
      }
      fVar28 = 1.0 / fVar28;
      uVar3 = *(undefined8 *)(this->m_swingAxis).m_floats;
      *(ulong *)(this->m_swingAxis).m_floats =
           CONCAT44(fVar28 * (float)((ulong)uVar3 >> 0x20),fVar28 * (float)uVar3);
      (this->m_swingAxis).m_floats[2] = fVar28 * (this->m_swingAxis).m_floats[2];
      fVar28 = -1.0;
      if (-1.0 <= local_248.m_floats[3]) {
        fVar28 = local_248.m_floats[3];
      }
      fVar29 = 1.0;
      if (fVar28 <= 1.0) {
        fVar29 = fVar28;
      }
      fVar28 = acosf(fVar29);
      this->m_swingCorrection = fVar28 + fVar28;
      if (1.1920929e-07 <= ABS(fVar28 + fVar28)) {
        this->m_solveSwingLimit = true;
      }
    }
  }
  else {
    btMatrix3x3::getRotation(&transA->m_basis,(btQuaternion *)&local_b8);
    bVar17 = local_b8.m_el[0].m_floats[3];
    bVar15 = local_b8.m_el[0].m_floats[2];
    bVar12 = local_b8.m_el[0].m_floats[1];
    bVar33 = local_b8.m_el[0].m_floats[0];
    btMatrix3x3::getRotation(&(this->m_rbAFrame).m_basis,(btQuaternion *)&local_b8);
    bVar13 = local_b8.m_el[0].m_floats[1];
    fVar31 = bVar33 * local_b8.m_el[0].m_floats[3];
    fVar37 = local_b8.m_el[0].m_floats[3] * 0.0;
    fVar29 = bVar17 * local_b8.m_el[0].m_floats[0];
    fVar32 = bVar12 * local_b8.m_el[0].m_floats[2];
    local_218._4_4_ = -bVar12;
    fVar28 = local_b8.m_el[0].m_floats[1] * 0.0;
    fVar40 = (bVar15 * local_b8.m_el[0].m_floats[0] +
             local_b8.m_el[0].m_floats[1] * bVar17 + bVar12 * local_b8.m_el[0].m_floats[3]) -
             local_b8.m_el[0].m_floats[2] * bVar33;
    fVar42 = (bVar33 * local_b8.m_el[0].m_floats[1] +
             local_b8.m_el[0].m_floats[2] * bVar17 + bVar15 * local_b8.m_el[0].m_floats[3]) -
             local_b8.m_el[0].m_floats[0] * bVar12;
    local_218._0_4_ =
         ((float)local_218._4_4_ * local_b8.m_el[0].m_floats[1] +
         local_b8.m_el[0].m_floats[3] * bVar17 + local_b8.m_el[0].m_floats[0] * -bVar33) -
         bVar15 * local_b8.m_el[0].m_floats[2];
    fStack_210 = (float)local_218._4_4_;
    fStack_20c = (float)local_218._4_4_;
    local_238 = fVar42;
    fStack_234 = fVar42;
    fStack_230 = fVar42;
    fStack_22c = fVar42;
    btMatrix3x3::getRotation(&transB->m_basis,(btQuaternion *)&local_b8);
    bVar18 = local_b8.m_el[0].m_floats[3];
    bVar16 = local_b8.m_el[0].m_floats[2];
    bVar14 = local_b8.m_el[0].m_floats[1];
    bVar33 = local_b8.m_el[0].m_floats[0];
    this_00 = (btConeTwistConstraint *)&this->m_rbBFrame;
    btMatrix3x3::getRotation((btMatrix3x3 *)this_00,(btQuaternion *)&local_b8);
    local_1a8._0_4_ =
         (bVar14 * local_b8.m_el[0].m_floats[2] +
         bVar18 * local_b8.m_el[0].m_floats[0] + bVar33 * local_b8.m_el[0].m_floats[3]) -
         bVar16 * local_b8.m_el[0].m_floats[1];
    local_1c8._4_4_ = -bVar14;
    fVar34 = (bVar16 * local_b8.m_el[0].m_floats[0] +
             local_b8.m_el[0].m_floats[1] * bVar18 + bVar14 * local_b8.m_el[0].m_floats[3]) -
             local_b8.m_el[0].m_floats[2] * bVar33;
    fVar35 = (bVar33 * local_b8.m_el[0].m_floats[1] +
             local_b8.m_el[0].m_floats[2] * bVar18 + bVar16 * local_b8.m_el[0].m_floats[3]) -
             local_b8.m_el[0].m_floats[0] * bVar14;
    fVar36 = (bVar18 * 0.0 + bVar18 * 0.0 + local_b8.m_el[0].m_floats[3] * 0.0) -
             local_b8.m_el[0].m_floats[3] * 0.0;
    fStack_13c = (bVar14 * 0.0 + bVar18 * 0.0 + local_b8.m_el[0].m_floats[3] * 0.0) -
                 local_b8.m_el[0].m_floats[1] * 0.0;
    local_1f8._4_4_ =
         ((float)local_1c8._4_4_ * local_b8.m_el[0].m_floats[1] +
         local_b8.m_el[0].m_floats[3] * bVar18 + local_b8.m_el[0].m_floats[0] * -bVar33) -
         bVar16 * local_b8.m_el[0].m_floats[2];
    local_228._4_4_ = local_218._0_4_;
    local_228._0_4_ = local_218._0_4_;
    fStack_220 = (float)local_218._0_4_;
    fStack_21c = (float)local_218._0_4_;
    fStack_200 = -(float)local_1a8._0_4_;
    local_1d8._0_8_ = CONCAT44(fVar35,fVar34) ^ 0x8000000080000000;
    local_1d8._8_4_ = -fVar36;
    fStack_1cc = -fStack_13c;
    fVar53 = (fVar32 + fVar29 + fVar31) - bVar13 * bVar15;
    local_138._4_4_ = bVar12;
    local_138._0_4_ = fVar53;
    fStack_130 = fVar42;
    fStack_12c = (bVar12 * 0.0 + bVar17 * 0.0 + fVar37) - fVar28;
    local_1f8._0_4_ = local_1f8._4_4_;
    fStack_1f0 = (float)local_1f8._4_4_;
    fStack_1ec = (float)local_1f8._4_4_;
    local_208 = (undefined1  [8])(CONCAT44(fVar34,local_1a8._0_4_) ^ 0x8000000080000000);
    fStack_1fc = fStack_200;
    fVar45 = fVar53 * fVar34 +
             fStack_200 * fVar40 +
             (fVar42 * (float)local_1f8._4_4_ - (float)local_218._0_4_ * fVar35);
    fVar47 = fVar40 * fVar35 +
             -fVar34 * fVar42 +
             (fVar53 * (float)local_1f8._4_4_ - (float)local_218._0_4_ * (float)local_1a8._0_4_);
    local_1c8._0_4_ = local_1f8._4_4_;
    fStack_1c0 = (float)local_1c8._4_4_;
    fStack_1bc = (float)local_1c8._4_4_;
    local_1b8._4_4_ = fVar35;
    local_1b8._0_4_ = fVar35;
    fStack_1b0 = fVar35;
    fStack_1ac = fVar35;
    fVar37 = fVar35 * local_238 +
             fVar34 * fVar40 +
             (float)local_1f8._4_4_ * (float)local_218._0_4_ + fVar53 * (float)local_1a8._0_4_;
    local_1e8._4_4_ = fStack_200;
    local_1e8._0_4_ = -fVar35;
    fStack_1e0 = -fVar36;
    fStack_1dc = -fStack_13c;
    local_1a8._4_4_ = bVar14;
    fStack_1a0 = bVar14;
    fStack_19c = bVar14;
    fVar32 = -fVar47 * 0.0 + fVar45 + fVar37 * 0.0;
    fVar36 = fVar42 * (float)local_1a8._0_4_ +
             ((float)local_1f8._4_4_ * fVar40 - (float)local_218._0_4_ * fVar34) + fVar53 * -fVar35;
    fVar31 = -fVar45 * 0.0;
    fVar28 = fVar36 * 0.0 + fVar37 + fVar31;
    fVar31 = (fVar36 * -0.0 - fVar47) + fVar31;
    fVar58 = (fVar37 * 0.0 + fVar47 * 0.0) - fVar36;
    fVar43 = fVar28 * fVar45 + ((fVar31 * -fVar36 + fVar37 * fVar32) - fVar47 * fVar58);
    fVar29 = fVar47 * fVar32 + ((-fVar45 * fVar31 + fVar37 * fVar58) - fVar28 * fVar36);
    fVar31 = fVar58 * fVar36 + ((-fVar47 * fVar31 + fVar37 * fVar28) - fVar32 * fVar45);
    fVar28 = fVar29 * fVar29 + fVar31 * fVar31 + fVar43 * fVar43;
    local_148._4_4_ = bVar14;
    local_148._0_4_ = local_1a8._0_4_;
    fStack_140 = fVar35;
    if (fVar28 < 0.0) {
      fVar28 = sqrtf(fVar28);
      uVar19 = extraout_EAX_00;
    }
    else {
      fVar28 = SQRT(fVar28);
      uVar19 = extraout_EAX;
    }
    fVar58 = 0.0;
    fVar32 = 0.0;
    fVar28 = 1.0 / fVar28;
    fVar43 = fVar43 * fVar28;
    fVar29 = fVar28 * fVar29;
    fVar28 = fVar28 * fVar31;
    fVar31 = fVar29 * 0.0 + fVar43 * 0.0 + fVar28;
    if (-0.9999999 <= fVar31) {
      fVar31 = fVar31 + 1.0;
      fVar31 = fVar31 + fVar31;
      if (fVar31 < 0.0) {
        fVar31 = sqrtf(fVar31);
        uVar19 = extraout_EAX_01;
      }
      else {
        fVar31 = SQRT(fVar31);
      }
      fVar32 = 1.0 / fVar31;
      fVar27 = fVar32 * (fVar29 * 0.0 + fVar43 * -0.0);
      fVar29 = fVar32 * (fVar28 * 0.0 + -fVar29);
      fVar32 = fVar32 * (fVar28 * -0.0 + fVar43);
      fVar58 = fVar31 * 0.5;
    }
    else {
      fVar27 = -0.0;
      fVar29 = 1.0;
    }
    fVar28 = fVar58 * fVar58 + fVar32 * fVar32 + fVar27 * fVar27 + fVar29 * fVar29;
    if (fVar28 < 0.0) {
      local_b8.m_el[0].m_floats[0] = fVar27;
      local_b8.m_el[0].m_floats[1] = fVar29;
      local_b8.m_el[0].m_floats[2] = fVar32;
      local_b8.m_el[0].m_floats[3] = fVar58;
      fVar28 = sqrtf(fVar28);
      uVar19 = extraout_EAX_02;
    }
    else {
      fVar28 = SQRT(fVar28);
    }
    fVar28 = 1.0 / fVar28;
    local_b8.m_el[0].m_floats[0] = fVar27 * fVar28;
    local_b8.m_el[0].m_floats[1] = fVar29 * fVar28;
    local_b8.m_el[0].m_floats[2] = fVar32 * fVar28;
    local_b8.m_el[0].m_floats[3] = fVar58 * fVar28;
    fVar29 = local_b8.m_el[0].m_floats[2] * fVar36 +
             ((fVar47 * local_b8.m_el[0].m_floats[3] + -local_b8.m_el[0].m_floats[0] * fVar37) -
             local_b8.m_el[0].m_floats[1] * fVar45);
    fVar31 = local_b8.m_el[0].m_floats[0] * fVar45 +
             ((fVar36 * local_b8.m_el[0].m_floats[3] + -local_b8.m_el[0].m_floats[1] * fVar37) -
             local_b8.m_el[0].m_floats[2] * fVar47);
    fVar32 = local_b8.m_el[0].m_floats[2] * fVar45 +
             local_b8.m_el[0].m_floats[1] * fVar36 +
             fVar37 * local_b8.m_el[0].m_floats[3] + local_b8.m_el[0].m_floats[0] * fVar47;
    fVar36 = local_b8.m_el[0].m_floats[1] * fVar47 +
             -local_b8.m_el[0].m_floats[0] * fVar36 +
             fVar45 * local_b8.m_el[0].m_floats[3] + -local_b8.m_el[0].m_floats[2] * fVar37;
    local_78.m_el[0].m_floats[1] = fVar31;
    local_78.m_el[0].m_floats[0] = fVar29;
    fVar28 = fVar32 * fVar32 + fVar36 * fVar36 + fVar29 * fVar29 + fVar31 * fVar31;
    if (fVar28 < 0.0) {
      local_78.m_el[0].m_floats[2] = fVar36;
      local_78.m_el[0].m_floats[3] = fVar32;
      fVar28 = sqrtf(fVar28);
      uVar19 = extraout_EAX_03;
    }
    else {
      fVar28 = SQRT(fVar28);
    }
    fVar28 = 1.0 / fVar28;
    local_78.m_el[0].m_floats[2] = fVar36 * fVar28;
    local_78.m_el[0].m_floats[3] = fVar32 * fVar28;
    local_78.m_el[0].m_floats[1] = fVar31 * fVar28;
    local_78.m_el[0].m_floats[0] = fVar29 * fVar28;
    fVar28 = this->m_swingSpan1;
    fVar29 = this->m_swingSpan2;
    fVar31 = this->m_fixThresh;
    if ((fVar28 < fVar31) || (fVar29 < fVar31)) {
      fVar32 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[0];
      fVar36 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[0];
      fVar37 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[0];
      fVar43 = (transA->m_basis).m_el[1].m_floats[0];
      fVar45 = (transA->m_basis).m_el[1].m_floats[1];
      fVar47 = (transA->m_basis).m_el[1].m_floats[2];
      fVar30 = fVar47 * fVar37 + fVar43 * fVar32 + fVar36 * fVar45;
      fVar54 = (transA->m_basis).m_el[2].m_floats[0];
      fVar1 = (transA->m_basis).m_el[2].m_floats[1];
      fVar58 = (this->m_rbBFrame).m_basis.m_el[0].m_floats[0];
      fVar27 = (this->m_rbBFrame).m_basis.m_el[1].m_floats[0];
      fVar48 = (this->m_rbBFrame).m_basis.m_el[2].m_floats[0];
      fVar23 = (transB->m_basis).m_el[0].m_floats[2] * fVar48 +
               (transB->m_basis).m_el[0].m_floats[0] * fVar58 +
               (transB->m_basis).m_el[0].m_floats[1] * fVar27;
      fVar52 = (transA->m_basis).m_el[0].m_floats[0];
      fVar50 = (transA->m_basis).m_el[0].m_floats[1];
      fVar56 = (transA->m_basis).m_el[2].m_floats[2];
      fVar2 = (transA->m_basis).m_el[0].m_floats[2];
      fVar38 = fVar37 * fVar56 + fVar32 * fVar54 + fVar1 * fVar36;
      fVar39 = fVar37 * fVar2 + fVar32 * fVar52 + fVar50 * fVar36;
      fVar55 = fVar48 * (transB->m_basis).m_el[1].m_floats[2] +
               fVar58 * (transB->m_basis).m_el[1].m_floats[0] +
               (transB->m_basis).m_el[1].m_floats[1] * fVar27;
      fVar57 = fVar48 * (transB->m_basis).m_el[2].m_floats[2] +
               fVar58 * (transB->m_basis).m_el[2].m_floats[0] +
               (transB->m_basis).m_el[2].m_floats[1] * fVar27;
      uVar3 = *(undefined8 *)((this->m_rbAFrame).m_basis.m_el[0].m_floats + 1);
      fVar32 = (float)uVar3;
      fVar36 = (float)((ulong)uVar3 >> 0x20);
      uVar3 = *(undefined8 *)((this->m_rbAFrame).m_basis.m_el[1].m_floats + 1);
      fVar48 = (float)uVar3;
      fVar44 = (float)((ulong)uVar3 >> 0x20);
      uVar3 = *(undefined8 *)((this->m_rbAFrame).m_basis.m_el[2].m_floats + 1);
      fVar58 = (float)uVar3;
      fVar27 = (float)((ulong)uVar3 >> 0x20);
      fVar51 = fVar2 * fVar58 + fVar52 * fVar32 + fVar50 * fVar48;
      fVar52 = fVar2 * fVar27 + fVar52 * fVar36 + fVar50 * fVar44;
      fVar37 = fVar47 * fVar58 + fVar43 * fVar32 + fVar45 * fVar48;
      fVar43 = fVar47 * fVar27 + fVar43 * fVar36 + fVar45 * fVar44;
      fVar45 = fVar56 * fVar58 + fVar54 * fVar32 + fVar1 * fVar48;
      fVar47 = fVar56 * fVar27 + fVar54 * fVar36 + fVar1 * fVar44;
      fVar36 = fVar57 * fVar45 + fVar23 * fVar51 + fVar55 * fVar37;
      fVar32 = fVar57 * fVar47 + fVar23 * fVar52 + fVar55 * fVar43;
      if ((fVar31 <= fVar28) || (fVar31 <= fVar29)) {
        fVar58 = fVar57 * fVar38 + fVar39 * fVar23 + fVar30 * fVar55;
        if (fVar31 <= fVar28) {
          if (((1.1920929e-07 <= ABS(fVar58)) || (1.1920929e-07 <= ABS(fVar36))) &&
             (this->m_solveSwingLimit = true, fVar31 <= fVar28)) {
            fVar29 = atan2f(fVar36,fVar58);
            fVar28 = this->m_swingSpan1;
            if (fVar29 <= fVar28) {
              fVar32 = 0.0;
              if (fVar29 < -fVar28) {
                fVar58 = cosf(fVar28);
                fVar36 = sinf(this->m_swingSpan1);
                fVar32 = 0.0;
                fVar36 = -fVar36;
              }
            }
            else {
              fVar58 = cosf(fVar28);
              fVar36 = sinf(this->m_swingSpan1);
              fVar32 = 0.0;
            }
          }
        }
        else if (((1.1920929e-07 <= ABS(fVar58)) || (1.1920929e-07 <= ABS(fVar32))) &&
                (this->m_solveSwingLimit = true, fVar31 <= fVar29)) {
          fVar29 = atan2f(fVar32,fVar58);
          fVar28 = this->m_swingSpan2;
          if (fVar29 <= fVar28) {
            fVar36 = 0.0;
            if (fVar29 < -fVar28) {
              fVar58 = cosf(fVar28);
              fVar32 = sinf(this->m_swingSpan2);
              fVar36 = 0.0;
              fVar32 = -fVar32;
            }
          }
          else {
            fVar58 = cosf(fVar28);
            fVar32 = sinf(this->m_swingSpan2);
            fVar36 = 0.0;
          }
        }
        fVar29 = fVar43 * fVar32 + fVar30 * fVar58 + fVar37 * fVar36;
        fVar31 = fVar47 * fVar32 + fVar58 * fVar38 + fVar36 * fVar45;
        fVar32 = fVar52 * fVar32 + fVar58 * fVar39 + fVar36 * fVar51;
        fVar28 = fVar31 * fVar31 + fVar32 * fVar32 + fVar29 * fVar29;
        if (fVar28 < 0.0) {
          fVar28 = sqrtf(fVar28);
        }
        else {
          fVar28 = SQRT(fVar28);
        }
        fVar28 = 1.0 / fVar28;
        auVar9._8_4_ = -(fVar29 * fVar28 * fVar23 + fVar28 * fVar32 * -fVar55);
        auVar9._0_8_ = CONCAT44(fVar57 * fVar28 * fVar32 - fVar28 * fVar31 * fVar23,
                                fVar55 * fVar28 * fVar31 - fVar29 * fVar28 * fVar57) ^
                       0x8000000080000000;
        auVar9._12_4_ = 0;
        *(undefined1 (*) [16])(this->m_swingAxis).m_floats = auVar9;
        fVar28 = (this->m_swingAxis).m_floats[0];
        fVar29 = (this->m_swingAxis).m_floats[1];
        fVar31 = (this->m_swingAxis).m_floats[2];
        fVar28 = fVar31 * fVar31 + fVar28 * fVar28 + fVar29 * fVar29;
        if (fVar28 < 0.0) {
          fVar28 = sqrtf(fVar28);
        }
        else {
          fVar28 = SQRT(fVar28);
        }
        this->m_swingCorrection = fVar28;
        if (1.1920929e-07 <= ABS(fVar28)) {
          fVar28 = (this->m_swingAxis).m_floats[0];
          fVar29 = (this->m_swingAxis).m_floats[1];
          fVar31 = (this->m_swingAxis).m_floats[2];
          fVar28 = fVar31 * fVar31 + fVar28 * fVar28 + fVar29 * fVar29;
          if (fVar28 < 0.0) {
            fVar28 = sqrtf(fVar28);
          }
          else {
            fVar28 = SQRT(fVar28);
          }
          fVar28 = 1.0 / fVar28;
          uVar3 = *(undefined8 *)(this->m_swingAxis).m_floats;
          *(ulong *)(this->m_swingAxis).m_floats =
               CONCAT44(fVar28 * (float)((ulong)uVar3 >> 0x20),fVar28 * (float)uVar3);
          (this->m_swingAxis).m_floats[2] = fVar28 * (this->m_swingAxis).m_floats[2];
        }
      }
      else {
        auVar7._4_4_ = -(uint)(ABS(fVar36) < 1.1920929e-07);
        auVar7._0_4_ = -(uint)(ABS(fVar36) < 1.1920929e-07);
        auVar7._8_4_ = -(uint)(ABS(fVar32) < 1.1920929e-07);
        auVar7._12_4_ = -(uint)(ABS(fVar32) < 1.1920929e-07);
        iVar20 = movmskpd(uVar19,auVar7);
        if (iVar20 != 3) {
          this->m_solveSwingLimit = true;
          auVar8._8_4_ = -(fVar23 * fVar30 - fVar39 * fVar55);
          auVar8._0_8_ = CONCAT44(fVar57 * fVar39 - fVar38 * fVar23,
                                  fVar55 * fVar38 - fVar30 * fVar57) ^ 0x8000000080000000;
          auVar8._12_4_ = 0;
          *(undefined1 (*) [16])(this->m_swingAxis).m_floats = auVar8;
        }
      }
    }
    else {
      local_120 = 0.0;
      this_00 = this;
      computeConeLimitInfo(this,(btQuaternion *)&local_b8,&local_11c,&local_248,&local_120);
      fVar28 = this->m_limitSoftness;
      if (local_120 * fVar28 < local_11c) {
        this->m_solveSwingLimit = true;
        bVar33 = 1.0;
        if ((local_11c < local_120) && (bVar33 = 1.0, fVar28 < 0.9999999)) {
          bVar33 = (-local_120 * fVar28 + local_11c) / (-local_120 * fVar28 + local_120);
        }
        this->m_swingLimitRatio = bVar33;
        this->m_swingCorrection = local_11c - local_120 * fVar28;
        this_00 = this;
        adjustSwingAxisToUseEllipseNormal(this,&local_248);
        fVar28 = local_248.m_floats[0];
        fVar36 = local_248.m_floats[1];
        fVar29 = (float)local_1a8._0_4_ * local_248.m_floats[2] +
                 (fVar35 * -fVar28 - (float)local_1c8._0_4_ * fVar36);
        fVar31 = fVar34 * fVar28 +
                 (-fVar36 * (float)local_1a8._0_4_ - (float)local_1f8._0_4_ * local_248.m_floats[2])
        ;
        fVar32 = fVar35 * fVar36 +
                 (-local_248.m_floats[2] * fVar34 - (float)local_1f8._4_4_ * fVar28);
        fVar28 = local_248.m_floats[2] * (float)local_1b8._0_4_ +
                 fVar28 * (float)local_1a8._0_4_ + fVar36 * fVar34;
        auVar4._4_4_ = fVar32 * fVar35 +
                       fVar31 * (float)local_1e8._4_4_ +
                       fVar28 * (float)local_208._4_4_ + fVar29 * (float)local_1f8._4_4_;
        auVar4._0_4_ = fVar31 * fVar34 +
                       fVar29 * (float)local_1e8._0_4_ +
                       fVar28 * (float)local_208._0_4_ + fVar32 * (float)local_1f8._0_4_;
        auVar4._8_4_ = fVar29 * (float)local_1a8._0_4_ +
                       fVar32 * (float)local_1d8._0_4_ +
                       fVar28 * (float)local_1e8._0_4_ + (float)local_1c8._0_4_ * fVar31;
        auVar4._12_4_ = 0;
        *(undefined1 (*) [16])(this->m_swingAxis).m_floats = auVar4;
        (this->m_twistAxisA).m_floats[0] = 0.0;
        (this->m_twistAxisA).m_floats[1] = 0.0;
        (this->m_twistAxisA).m_floats[2] = 0.0;
        (this->m_twistAxisA).m_floats[3] = 0.0;
        fVar28 = (this->m_swingAxis).m_floats[0];
        fVar29 = (this->m_swingAxis).m_floats[1];
        fVar31 = (this->m_swingAxis).m_floats[2];
        this->m_kSwing =
             1.0 / ((invInertiaWorldB->m_el[2].m_floats[2] * fVar31 +
                    invInertiaWorldB->m_el[0].m_floats[2] * fVar28 +
                    invInertiaWorldB->m_el[1].m_floats[2] * fVar29) * fVar31 +
                    (invInertiaWorldB->m_el[2].m_floats[0] * fVar31 +
                    invInertiaWorldB->m_el[0].m_floats[0] * fVar28 +
                    invInertiaWorldB->m_el[1].m_floats[0] * fVar29) * fVar28 +
                    (invInertiaWorldB->m_el[2].m_floats[1] * fVar31 +
                    invInertiaWorldB->m_el[0].m_floats[1] * fVar28 +
                    invInertiaWorldB->m_el[1].m_floats[1] * fVar29) * fVar29 +
                   (invInertiaWorldA->m_el[2].m_floats[2] * fVar31 +
                   invInertiaWorldA->m_el[0].m_floats[2] * fVar28 +
                   invInertiaWorldA->m_el[1].m_floats[2] * fVar29) * fVar31 +
                   (invInertiaWorldA->m_el[2].m_floats[0] * fVar31 +
                   invInertiaWorldA->m_el[0].m_floats[0] * fVar28 +
                   invInertiaWorldA->m_el[1].m_floats[0] * fVar29) * fVar28 +
                   (invInertiaWorldA->m_el[2].m_floats[1] * fVar31 +
                   invInertiaWorldA->m_el[0].m_floats[1] * fVar28 +
                   invInertiaWorldA->m_el[1].m_floats[1] * fVar29) * fVar29);
      }
    }
    if (0.0 <= this->m_twistSpan) {
      computeTwistLimitInfo(this_00,(btQuaternion *)&local_78,&this->m_twistAngle,&local_248);
      fVar28 = this->m_twistAngle;
      fVar29 = this->m_limitSoftness;
      fVar31 = this->m_twistSpan;
      fVar32 = local_248.m_floats[0];
      fVar36 = local_248.m_floats[1];
      if (fVar31 * fVar29 < fVar28) {
        this->m_solveTwistLimit = true;
        bVar33 = 1.0;
        if ((fVar28 < fVar31) && (bVar33 = 1.0, fVar29 < 0.9999999)) {
          bVar33 = (-fVar31 * fVar29 + fVar28) / (-fVar31 * fVar29 + fVar31);
        }
        this->m_twistLimitRatio = bVar33;
        this->m_twistCorrection = fVar28 - fVar31 * fVar29;
        fVar28 = (float)local_1a8._0_4_ * local_248.m_floats[2] +
                 (fVar35 * -fVar32 - (float)local_1c8._0_4_ * fVar36);
        fVar29 = fVar34 * fVar32 +
                 (-fVar36 * (float)local_148._0_4_ - local_248.m_floats[2] * (float)local_1f8._0_4_)
        ;
        fVar31 = fVar35 * fVar36 +
                 (-local_248.m_floats[2] * fVar34 - fVar32 * (float)local_1f8._4_4_);
        fVar37 = (float)local_1b8._0_4_ * local_248.m_floats[2] +
                 fVar32 * (float)local_1a8._0_4_ + fVar36 * fVar34;
        auVar6._4_4_ = fVar35 * fVar31 +
                       fVar29 * (float)local_1e8._4_4_ +
                       fVar37 * (float)local_208._4_4_ + fVar28 * (float)local_1f8._4_4_;
        auVar6._0_4_ = fVar34 * fVar29 +
                       fVar28 * (float)local_1e8._0_4_ +
                       fVar37 * (float)local_208._0_4_ + fVar31 * (float)local_1f8._0_4_;
        auVar6._8_4_ = fVar28 * (float)local_1a8._0_4_ +
                       fVar31 * (float)local_1d8._0_4_ +
                       fVar37 * (float)local_1e8._0_4_ + fVar29 * (float)local_1c8._0_4_;
        auVar6._12_4_ = 0;
        *(undefined1 (*) [16])(this->m_twistAxis).m_floats = auVar6;
        fVar28 = (this->m_twistAxis).m_floats[0];
        fVar29 = (this->m_twistAxis).m_floats[1];
        fVar31 = (this->m_twistAxis).m_floats[2];
        this->m_kTwist =
             1.0 / ((invInertiaWorldB->m_el[2].m_floats[2] * fVar31 +
                    invInertiaWorldB->m_el[0].m_floats[2] * fVar28 +
                    invInertiaWorldB->m_el[1].m_floats[2] * fVar29) * fVar31 +
                    (invInertiaWorldB->m_el[2].m_floats[0] * fVar31 +
                    invInertiaWorldB->m_el[0].m_floats[0] * fVar28 +
                    invInertiaWorldB->m_el[1].m_floats[0] * fVar29) * fVar28 +
                    (invInertiaWorldB->m_el[2].m_floats[1] * fVar31 +
                    invInertiaWorldB->m_el[0].m_floats[1] * fVar28 +
                    invInertiaWorldB->m_el[1].m_floats[1] * fVar29) * fVar29 +
                   (invInertiaWorldA->m_el[2].m_floats[2] * fVar31 +
                   invInertiaWorldA->m_el[0].m_floats[2] * fVar28 +
                   invInertiaWorldA->m_el[1].m_floats[2] * fVar29) * fVar31 +
                   (invInertiaWorldA->m_el[2].m_floats[0] * fVar31 +
                   invInertiaWorldA->m_el[0].m_floats[0] * fVar28 +
                   invInertiaWorldA->m_el[1].m_floats[0] * fVar29) * fVar28 +
                   (invInertiaWorldA->m_el[2].m_floats[1] * fVar31 +
                   invInertiaWorldA->m_el[0].m_floats[1] * fVar28 +
                   invInertiaWorldA->m_el[1].m_floats[1] * fVar29) * fVar29);
      }
      if (this->m_solveSwingLimit == true) {
        fVar28 = fVar53 * local_248.m_floats[2] +
                 (fVar42 * -fVar32 - (float)local_218._0_4_ * fVar36);
        fVar29 = fVar40 * fVar32 +
                 (-fVar36 * fVar53 - local_248.m_floats[2] * (float)local_228._0_4_);
        fVar31 = fVar42 * fVar36 +
                 (-local_248.m_floats[2] * fVar40 - fVar32 * (float)local_228._4_4_);
        fVar32 = local_238 * local_248.m_floats[2] + fVar32 * fVar53 + fVar36 * fVar40;
        auVar5._4_4_ = fVar42 * fVar31 +
                       ((-fVar40 * fVar32 + fVar28 * (float)local_228._4_4_) -
                       fVar29 * (float)local_138._0_4_);
        auVar5._0_4_ = fVar40 * fVar29 +
                       ((-(float)local_138._0_4_ * fVar32 + fVar31 * (float)local_228._0_4_) -
                       fVar28 * fStack_130);
        auVar5._8_4_ = fVar28 * fVar53 +
                       ((fVar32 * -fStack_130 + fVar29 * (float)local_218._0_4_) - fVar31 * fVar40);
        auVar5._12_4_ = 0;
        *(undefined1 (*) [16])(this->m_twistAxisA).m_floats = auVar5;
      }
    }
    else {
      this->m_twistAngle = 0.0;
    }
  }
  return;
}

Assistant:

void btConeTwistConstraint::calcAngleInfo2(const btTransform& transA, const btTransform& transB, const btMatrix3x3& invInertiaWorldA,const btMatrix3x3& invInertiaWorldB)
{
	m_swingCorrection = btScalar(0.);
	m_twistLimitSign = btScalar(0.);
	m_solveTwistLimit = false;
	m_solveSwingLimit = false;
	// compute rotation of A wrt B (in constraint space)
	if (m_bMotorEnabled && (!m_useSolveConstraintObsolete))
	{	// it is assumed that setMotorTarget() was alredy called 
		// and motor target m_qTarget is within constraint limits
		// TODO : split rotation to pure swing and pure twist
		// compute desired transforms in world
		btTransform trPose(m_qTarget);
		btTransform trA = transA * m_rbAFrame;
		btTransform trB = transB * m_rbBFrame;
		btTransform trDeltaAB = trB * trPose * trA.inverse();
		btQuaternion qDeltaAB = trDeltaAB.getRotation();
		btVector3 swingAxis = 	btVector3(qDeltaAB.x(), qDeltaAB.y(), qDeltaAB.z());
		float swingAxisLen2 = swingAxis.length2();
		if(btFuzzyZero(swingAxisLen2))
		{
		   return;
		}
		m_swingAxis = swingAxis;
		m_swingAxis.normalize();
		m_swingCorrection = qDeltaAB.getAngle();
		if(!btFuzzyZero(m_swingCorrection))
		{
			m_solveSwingLimit = true;
		}
		return;
	}


	{
		// compute rotation of A wrt B (in constraint space)
		btQuaternion qA = transA.getRotation() * m_rbAFrame.getRotation();
		btQuaternion qB = transB.getRotation() * m_rbBFrame.getRotation();
		btQuaternion qAB = qB.inverse() * qA;
		// split rotation into cone and twist
		// (all this is done from B's perspective. Maybe I should be averaging axes...)
		btVector3 vConeNoTwist = quatRotate(qAB, vTwist); vConeNoTwist.normalize();
		btQuaternion qABCone  = shortestArcQuat(vTwist, vConeNoTwist); qABCone.normalize();
		btQuaternion qABTwist = qABCone.inverse() * qAB; qABTwist.normalize();

		if (m_swingSpan1 >= m_fixThresh && m_swingSpan2 >= m_fixThresh)
		{
			btScalar swingAngle, swingLimit = 0; btVector3 swingAxis;
			computeConeLimitInfo(qABCone, swingAngle, swingAxis, swingLimit);

			if (swingAngle > swingLimit * m_limitSoftness)
			{
				m_solveSwingLimit = true;

				// compute limit ratio: 0->1, where
				// 0 == beginning of soft limit
				// 1 == hard/real limit
				m_swingLimitRatio = 1.f;
				if (swingAngle < swingLimit && m_limitSoftness < 1.f - SIMD_EPSILON)
				{
					m_swingLimitRatio = (swingAngle - swingLimit * m_limitSoftness)/
										(swingLimit - swingLimit * m_limitSoftness);
				}				

				// swing correction tries to get back to soft limit
				m_swingCorrection = swingAngle - (swingLimit * m_limitSoftness);

				// adjustment of swing axis (based on ellipse normal)
				adjustSwingAxisToUseEllipseNormal(swingAxis);

				// Calculate necessary axis & factors		
				m_swingAxis = quatRotate(qB, -swingAxis);

				m_twistAxisA.setValue(0,0,0);

				m_kSwing =  btScalar(1.) /
					(computeAngularImpulseDenominator(m_swingAxis,invInertiaWorldA) +
					 computeAngularImpulseDenominator(m_swingAxis,invInertiaWorldB));
			}
		}
		else
		{
			// you haven't set any limits;
			// or you're trying to set at least one of the swing limits too small. (if so, do you really want a conetwist constraint?)
			// anyway, we have either hinge or fixed joint
			btVector3 ivA = transA.getBasis() * m_rbAFrame.getBasis().getColumn(0);
			btVector3 jvA = transA.getBasis() * m_rbAFrame.getBasis().getColumn(1);
			btVector3 kvA = transA.getBasis() * m_rbAFrame.getBasis().getColumn(2);
			btVector3 ivB = transB.getBasis() * m_rbBFrame.getBasis().getColumn(0);
			btVector3 target;
			btScalar x = ivB.dot(ivA);
			btScalar y = ivB.dot(jvA);
			btScalar z = ivB.dot(kvA);
			if((m_swingSpan1 < m_fixThresh) && (m_swingSpan2 < m_fixThresh))
			{ // fixed. We'll need to add one more row to constraint
				if((!btFuzzyZero(y)) || (!(btFuzzyZero(z))))
				{
					m_solveSwingLimit = true;
					m_swingAxis = -ivB.cross(ivA);
				}
			}
			else
			{
				if(m_swingSpan1 < m_fixThresh)
				{ // hinge around Y axis
//					if(!(btFuzzyZero(y)))
					if((!(btFuzzyZero(x))) || (!(btFuzzyZero(z))))
					{
						m_solveSwingLimit = true;
						if(m_swingSpan2 >= m_fixThresh)
						{
							y = btScalar(0.f);
							btScalar span2 = btAtan2(z, x);
							if(span2 > m_swingSpan2)
							{
								x = btCos(m_swingSpan2);
								z = btSin(m_swingSpan2);
							}
							else if(span2 < -m_swingSpan2)
							{
								x =  btCos(m_swingSpan2);
								z = -btSin(m_swingSpan2);
							}
						}
					}
				}
				else
				{ // hinge around Z axis
//					if(!btFuzzyZero(z))
					if((!(btFuzzyZero(x))) || (!(btFuzzyZero(y))))
					{
						m_solveSwingLimit = true;
						if(m_swingSpan1 >= m_fixThresh)
						{
							z = btScalar(0.f);
							btScalar span1 = btAtan2(y, x);
							if(span1 > m_swingSpan1)
							{
								x = btCos(m_swingSpan1);
								y = btSin(m_swingSpan1);
							}
							else if(span1 < -m_swingSpan1)
							{
								x =  btCos(m_swingSpan1);
								y = -btSin(m_swingSpan1);
							}
						}
					}
				}
				target[0] = x * ivA[0] + y * jvA[0] + z * kvA[0];
				target[1] = x * ivA[1] + y * jvA[1] + z * kvA[1];
				target[2] = x * ivA[2] + y * jvA[2] + z * kvA[2];
				target.normalize();
				m_swingAxis = -ivB.cross(target);
                                m_swingCorrection = m_swingAxis.length();

                                if (!btFuzzyZero(m_swingCorrection))
                                    m_swingAxis.normalize();
			}
		}

		if (m_twistSpan >= btScalar(0.f))
		{
			btVector3 twistAxis;
			computeTwistLimitInfo(qABTwist, m_twistAngle, twistAxis);

			if (m_twistAngle > m_twistSpan*m_limitSoftness)
			{
				m_solveTwistLimit = true;

				m_twistLimitRatio = 1.f;
				if (m_twistAngle < m_twistSpan && m_limitSoftness < 1.f - SIMD_EPSILON)
				{
					m_twistLimitRatio = (m_twistAngle - m_twistSpan * m_limitSoftness)/
										(m_twistSpan  - m_twistSpan * m_limitSoftness);
				}

				// twist correction tries to get back to soft limit
				m_twistCorrection = m_twistAngle - (m_twistSpan * m_limitSoftness);

				m_twistAxis = quatRotate(qB, -twistAxis);

				m_kTwist = btScalar(1.) /
					(computeAngularImpulseDenominator(m_twistAxis,invInertiaWorldA) +
					 computeAngularImpulseDenominator(m_twistAxis,invInertiaWorldB));
			}

			if (m_solveSwingLimit)
				m_twistAxisA = quatRotate(qA, -twistAxis);
		}
		else
		{
			m_twistAngle = btScalar(0.f);
		}
	}
}